

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeleton(OgreBinarySerializer *this,Skeleton *skeleton)

{
  pointer ppBVar1;
  pointer ppBVar2;
  Bone *this_00;
  bool bVar3;
  uint16_t uVar4;
  Logger *pLVar5;
  DeadlyImportError *pDVar6;
  Skeleton *pSVar7;
  long lVar8;
  bool bVar9;
  string version;
  string local_1c8;
  string local_1a8 [11];
  
  uVar4 = Read<unsigned_short>(this);
  if (uVar4 != 0x1000) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"Invalid Ogre Skeleton file header.",(allocator<char> *)&version)
    ;
    DeadlyImportError::DeadlyImportError(pDVar6,local_1a8);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ReadLine_abi_cxx11_(&version,this);
  bVar3 = std::operator!=(&version,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)SKELETON_VERSION_1_8_abi_cxx11_);
  if (bVar3) {
    bVar3 = std::operator!=(&version,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)SKELETON_VERSION_1_1_abi_cxx11_);
    if (bVar3) {
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator<<((ostream *)local_1a8,"Skeleton version ");
      std::operator<<((ostream *)local_1a8,(string *)&version);
      std::operator<<((ostream *)local_1a8," not supported by this importer.");
      std::operator<<((ostream *)local_1a8," Supported versions: ");
      std::operator<<((ostream *)local_1a8,(string *)SKELETON_VERSION_1_8_abi_cxx11_);
      std::operator<<((ostream *)local_1a8," and ");
      std::operator<<((ostream *)local_1a8,(string *)SKELETON_VERSION_1_1_abi_cxx11_);
      std::__cxx11::stringbuf::str();
      DeadlyImportError::DeadlyImportError(pDVar6,&local_1c8);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"Reading Skeleton");
  bVar3 = true;
  bVar9 = true;
  while (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
    pSVar7 = (Skeleton *)0x1;
    uVar4 = ReadHeader(this,true);
    if (uVar4 == 0x1010) {
      uVar4 = Read<unsigned_short>(this);
      skeleton->blendMode = (uint)uVar4;
    }
    else if (uVar4 == 0x3000) {
      ReadBoneParent(this,skeleton);
    }
    else if (uVar4 == 0x5000) {
      ReadSkeletonAnimationLink(this,pSVar7);
    }
    else if (uVar4 == 0x2000) {
      if (bVar3) {
        pLVar5 = DefaultLogger::get();
        Logger::debug(pLVar5,"  - Bones");
      }
      bVar3 = false;
      ReadBone(this,skeleton);
    }
    else if (uVar4 == 0x4000) {
      if (bVar9) {
        pLVar5 = DefaultLogger::get();
        Logger::debug(pLVar5,"  - Animations");
      }
      bVar9 = false;
      ReadSkeletonAnimation(this,skeleton);
    }
  }
  ppBVar1 = (skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppBVar2 = (skeleton->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar8 = 0; (long)ppBVar1 - (long)ppBVar2 >> 3 != lVar8; lVar8 = lVar8 + 1) {
    this_00 = (skeleton->bones).
              super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8];
    bVar3 = Bone::IsParented(this_00);
    if (!bVar3) {
      Bone::CalculateWorldMatrixAndDefaultPose(this_00,skeleton);
    }
  }
  std::__cxx11::string::~string((string *)&version);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeleton(Skeleton *skeleton)
{
    uint16_t id = ReadHeader(false);
    if (id != HEADER_CHUNK_ID) {
        throw DeadlyExportError("Invalid Ogre Skeleton file header.");
    }

    // This deserialization supports both versions of the skeleton spec
    std::string version = ReadLine();
    if (version != SKELETON_VERSION_1_8 && version != SKELETON_VERSION_1_1)
    {
        throw DeadlyExportError(Formatter::format() << "Skeleton version " << version << " not supported by this importer."
            << " Supported versions: " << SKELETON_VERSION_1_8 << " and " << SKELETON_VERSION_1_1);
    }

    ASSIMP_LOG_DEBUG("Reading Skeleton");

    bool firstBone = true;
    bool firstAnim = true;

    while (!AtEnd())
    {
        id = ReadHeader();
        switch(id)
        {
            case SKELETON_BLENDMODE:
            {
                skeleton->blendMode = static_cast<Skeleton::BlendMode>(Read<uint16_t>());
                break;
            }
            case SKELETON_BONE:
            {
                if (firstBone)
                {
                    ASSIMP_LOG_DEBUG("  - Bones");
                    firstBone = false;
                }

                ReadBone(skeleton);
                break;
            }
            case SKELETON_BONE_PARENT:
            {
                ReadBoneParent(skeleton);
                break;
            }
            case SKELETON_ANIMATION:
            {
                if (firstAnim)
                {
                    ASSIMP_LOG_DEBUG("  - Animations");
                    firstAnim = false;
                }

                ReadSkeletonAnimation(skeleton);
                break;
            }
            case SKELETON_ANIMATION_LINK:
            {
                ReadSkeletonAnimationLink(skeleton);
                break;
            }
        }
    }

    // Calculate bone matrices for root bones. Recursively calculates their children.
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *bone = skeleton->bones[i];
        if (!bone->IsParented())
            bone->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}